

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfg_structurizer.cpp
# Opt level: O0

void __thiscall dxil_spv::CFGStructurizer::backwards_visit(CFGStructurizer *this)

{
  CFGNode *pCVar1;
  bool bVar2;
  reference ppCVar3;
  size_type __n;
  reference ppCVar4;
  iterator iVar5;
  iterator iVar6;
  size_type sVar7;
  CFGNode *pCVar8;
  reference ppCVar9;
  CFGNode *leaf_2;
  iterator __end1_2;
  iterator __begin1_2;
  Vector<CFGNode_*> *__range1_2;
  CFGNode *leaf_1;
  iterator __end2_1;
  iterator __begin2_1;
  Vector<CFGNode_*> *__range2_1;
  CFGNode *node_2;
  iterator __end2;
  iterator __begin2;
  Vector<CFGNode_*> *__range2;
  CFGNode *f_1;
  iterator __end5_1;
  iterator __begin5_1;
  Vector<CFGNode_*> *__range5_1;
  CFGNode *f;
  iterator __end5;
  iterator __begin5;
  Vector<CFGNode_*> *__range5;
  CFGNode *innermost_header;
  CFGNode *exit_node_1;
  bool transpose_loop_exit;
  CFGNode *local_168;
  CFGNode *exit_node;
  iterator __end4;
  iterator __begin4;
  UnorderedSet<CFGNode_*> *__range4;
  Vector<CFGNode_*> exits;
  LoopMergeTracer merge_tracer;
  LoopBacktracer tracer;
  CFGNode *node_1;
  size_t i;
  bool need_revisit;
  CFGNode *leaf;
  iterator __end1_1;
  iterator __begin1_1;
  Vector<CFGNode_*> *__range1_1;
  CFGNode *node;
  iterator __end1;
  iterator __begin1;
  Vector<CFGNode_*> *__range1;
  Vector<CFGNode_*> leaf_nodes;
  CFGStructurizer *this_local;
  
  leaf_nodes.
  super__Vector_base<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = &this->entry_block;
  std::vector<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>::vector
            ((vector<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_> *)
             &__range1);
  __end1 = std::vector<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>::
           begin(&this->forward_post_visit_order);
  node = (CFGNode *)
         std::vector<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>::end
                   (&this->forward_post_visit_order);
  while (bVar2 = __gnu_cxx::operator!=
                           (&__end1,(__normal_iterator<dxil_spv::CFGNode_**,_std::vector<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>_>
                                     *)&node), bVar2) {
    ppCVar9 = __gnu_cxx::
              __normal_iterator<dxil_spv::CFGNode_**,_std::vector<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>_>
              ::operator*(&__end1);
    __range1_1 = (Vector<CFGNode_*> *)*ppCVar9;
    ((CFGNode *)__range1_1)->backward_visited = false;
    ((CFGNode *)__range1_1)->traversing = false;
    bVar2 = std::vector<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>::
            empty(&((CFGNode *)__range1_1)->succ);
    if ((bVar2) &&
       (__range1_1[0x10].
        super__Vector_base<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage == (pointer)0x0)) {
      std::vector<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>::
      push_back((vector<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_> *
                )&__range1,(value_type *)&__range1_1);
    }
    __gnu_cxx::
    __normal_iterator<dxil_spv::CFGNode_**,_std::vector<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>_>
    ::operator++(&__end1);
  }
  __end1_1 = std::vector<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>
             ::begin((vector<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>
                      *)&__range1);
  leaf = (CFGNode *)
         std::vector<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>::end
                   ((vector<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>
                     *)&__range1);
  while (bVar2 = __gnu_cxx::operator!=
                           (&__end1_1,
                            (__normal_iterator<dxil_spv::CFGNode_**,_std::vector<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>_>
                             *)&leaf), bVar2) {
    ppCVar9 = __gnu_cxx::
              __normal_iterator<dxil_spv::CFGNode_**,_std::vector<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>_>
              ::operator*(&__end1_1);
    backwards_visit(this,*ppCVar9);
    __gnu_cxx::
    __normal_iterator<dxil_spv::CFGNode_**,_std::vector<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>_>
    ::operator++(&__end1_1);
  }
  bVar2 = false;
  for (node_1 = (CFGNode *)
                std::
                vector<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>::
                size(&this->forward_post_visit_order); node_1 != (CFGNode *)0x0;
      node_1 = (CFGNode *)
               ((long)&node_1[-1].post_dominance_frontier.
                       super__Vector_base<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage + 7)) {
    ppCVar3 = std::vector<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>
              ::operator[](&this->forward_post_visit_order,
                           (size_type)
                           ((long)&node_1[-1].post_dominance_frontier.
                                   super__Vector_base<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>
                                   ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
    pCVar1 = *ppCVar3;
    if ((pCVar1->pred_back_edge != (CFGNode *)0x0) &&
       ((pCVar1->pred_back_edge->backward_visited & 1U) == 0)) {
      LoopBacktracer::LoopBacktracer
                ((LoopBacktracer *)&merge_tracer.traced_blocks._M_h._M_single_bucket);
      LoopBacktracer::trace_to_parent
                ((LoopBacktracer *)&merge_tracer.traced_blocks._M_h._M_single_bucket,pCVar1,
                 pCVar1->pred_back_edge);
      LoopMergeTracer::LoopMergeTracer
                ((LoopMergeTracer *)
                 &exits.
                  super__Vector_base<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage,
                 (LoopBacktracer *)&merge_tracer.traced_blocks._M_h._M_single_bucket);
      LoopMergeTracer::trace_from_parent
                ((LoopMergeTracer *)
                 &exits.
                  super__Vector_base<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage,pCVar1);
      std::vector<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>::vector
                ((vector<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>
                  *)&__range4);
      __n = std::
            unordered_set<dxil_spv::CFGNode_*,_std::hash<dxil_spv::CFGNode_*>,_std::equal_to<dxil_spv::CFGNode_*>,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>
            ::size((unordered_set<dxil_spv::CFGNode_*,_std::hash<dxil_spv::CFGNode_*>,_std::equal_to<dxil_spv::CFGNode_*>,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>
                    *)&merge_tracer);
      std::vector<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>::
      reserve((vector<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_> *)
              &__range4,__n);
      __end4 = std::
               unordered_set<dxil_spv::CFGNode_*,_std::hash<dxil_spv::CFGNode_*>,_std::equal_to<dxil_spv::CFGNode_*>,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>
               ::begin((unordered_set<dxil_spv::CFGNode_*,_std::hash<dxil_spv::CFGNode_*>,_std::equal_to<dxil_spv::CFGNode_*>,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>
                        *)&merge_tracer);
      exit_node = (CFGNode *)
                  std::
                  unordered_set<dxil_spv::CFGNode_*,_std::hash<dxil_spv::CFGNode_*>,_std::equal_to<dxil_spv::CFGNode_*>,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>
                  ::end((unordered_set<dxil_spv::CFGNode_*,_std::hash<dxil_spv::CFGNode_*>,_std::equal_to<dxil_spv::CFGNode_*>,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>
                         *)&merge_tracer);
      while (bVar2 = std::__detail::operator!=
                               (&__end4.super__Node_iterator_base<dxil_spv::CFGNode_*,_false>,
                                (_Node_iterator_base<dxil_spv::CFGNode_*,_false> *)&exit_node),
            bVar2) {
        ppCVar4 = std::__detail::_Node_iterator<dxil_spv::CFGNode_*,_true,_false>::operator*
                            (&__end4);
        local_168 = *ppCVar4;
        std::vector<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>::
        push_back((vector<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>
                   *)&__range4,&local_168);
        std::__detail::_Node_iterator<dxil_spv::CFGNode_*,_true,_false>::operator++(&__end4);
      }
      iVar5 = std::vector<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>
              ::begin((vector<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>
                       *)&__range4);
      iVar6 = std::vector<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>
              ::end((vector<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>
                     *)&__range4);
      std::
      sort<__gnu_cxx::__normal_iterator<dxil_spv::CFGNode**,std::vector<dxil_spv::CFGNode*,dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode*>>>,dxil_spv::CFGStructurizer::backwards_visit()::__0>
                (iVar5._M_current,iVar6._M_current);
      exit_node_1._6_1_ = false;
      sVar7 = std::vector<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>
              ::size((vector<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>
                      *)&__range4);
      if (sVar7 == 1) {
        ppCVar3 = std::
                  vector<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>
                  ::front((vector<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>
                           *)&__range4);
        pCVar8 = *ppCVar3;
        exit_node_1._6_1_ = CFGNode::dominates_all_reachable_exits(pCVar8);
        if (exit_node_1._6_1_) {
          pCVar8 = get_innermost_loop_header_for(this,pCVar1,pCVar8);
          exit_node_1._6_1_ = pCVar8 == pCVar1;
        }
      }
      if (exit_node_1._6_1_ == false) {
        __end5_1 = std::
                   vector<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>
                   ::begin((vector<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>
                            *)&__range4);
        f_1 = (CFGNode *)
              std::vector<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>
              ::end((vector<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>
                     *)&__range4);
        while (bVar2 = __gnu_cxx::operator!=
                                 (&__end5_1,
                                  (__normal_iterator<dxil_spv::CFGNode_**,_std::vector<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>_>
                                   *)&f_1), bVar2) {
          ppCVar9 = __gnu_cxx::
                    __normal_iterator<dxil_spv::CFGNode_**,_std::vector<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>_>
                    ::operator*(&__end5_1);
          pCVar8 = *ppCVar9;
          bVar2 = CFGNode::reaches_backward_visited_node(pCVar8);
          if (bVar2) {
            CFGNode::add_fake_branch(pCVar1->pred_back_edge,pCVar8);
          }
          __gnu_cxx::
          __normal_iterator<dxil_spv::CFGNode_**,_std::vector<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>_>
          ::operator++(&__end5_1);
        }
      }
      else {
        __end5 = std::
                 vector<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>::
                 begin((vector<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>
                        *)&__range4);
        f = (CFGNode *)
            std::vector<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>::
            end((vector<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_> *
                )&__range4);
        while (bVar2 = __gnu_cxx::operator!=
                                 (&__end5,(__normal_iterator<dxil_spv::CFGNode_**,_std::vector<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>_>
                                           *)&f), bVar2) {
          ppCVar9 = __gnu_cxx::
                    __normal_iterator<dxil_spv::CFGNode_**,_std::vector<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>_>
                    ::operator*(&__end5);
          CFGNode::add_branch(pCVar1->pred_back_edge,*ppCVar9);
          __gnu_cxx::
          __normal_iterator<dxil_spv::CFGNode_**,_std::vector<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>_>
          ::operator++(&__end5);
        }
      }
      bVar2 = std::vector<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>
              ::empty(&pCVar1->pred_back_edge->succ);
      if ((!bVar2) ||
         (bVar2 = std::
                  vector<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>
                  ::empty(&pCVar1->pred_back_edge->fake_succ), !bVar2)) {
        pCVar1->pred_back_edge->backward_visited = true;
      }
      bVar2 = true;
      std::vector<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>::
      ~vector((vector<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_> *)
              &__range4);
      LoopMergeTracer::~LoopMergeTracer
                ((LoopMergeTracer *)
                 &exits.
                  super__Vector_base<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage);
      LoopBacktracer::~LoopBacktracer
                ((LoopBacktracer *)&merge_tracer.traced_blocks._M_h._M_single_bucket);
    }
  }
  if (bVar2) {
    __end2 = std::vector<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>
             ::begin(&this->forward_post_visit_order);
    node_2 = (CFGNode *)
             std::vector<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>
             ::end(&this->forward_post_visit_order);
    while (bVar2 = __gnu_cxx::operator!=
                             (&__end2,(__normal_iterator<dxil_spv::CFGNode_**,_std::vector<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>_>
                                       *)&node_2), bVar2) {
      ppCVar9 = __gnu_cxx::
                __normal_iterator<dxil_spv::CFGNode_**,_std::vector<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>_>
                ::operator*(&__end2);
      pCVar1 = *ppCVar9;
      pCVar1->backward_visited = false;
      pCVar1->traversing = false;
      pCVar1->backward_post_visit_order = 0;
      __gnu_cxx::
      __normal_iterator<dxil_spv::CFGNode_**,_std::vector<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>_>
      ::operator++(&__end2);
    }
    __end2_1 = std::
               vector<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>::
               begin((vector<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>
                      *)&__range1);
    leaf_1 = (CFGNode *)
             std::vector<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>
             ::end((vector<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>
                    *)&__range1);
    while (bVar2 = __gnu_cxx::operator!=
                             (&__end2_1,
                              (__normal_iterator<dxil_spv::CFGNode_**,_std::vector<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>_>
                               *)&leaf_1), bVar2) {
      ppCVar9 = __gnu_cxx::
                __normal_iterator<dxil_spv::CFGNode_**,_std::vector<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>_>
                ::operator*(&__end2_1);
      backwards_visit(this,*ppCVar9);
      __gnu_cxx::
      __normal_iterator<dxil_spv::CFGNode_**,_std::vector<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>_>
      ::operator++(&__end2_1);
    }
  }
  sVar7 = std::vector<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>::
          size(&this->backward_post_visit_order);
  this->exit_block->backward_post_visit_order = (uint32_t)sVar7;
  this->exit_block->immediate_post_dominator = this->exit_block;
  this->exit_block->backward_visited = true;
  __end1_2 = std::vector<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>
             ::begin((vector<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>
                      *)&__range1);
  leaf_2 = (CFGNode *)
           std::vector<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>::
           end((vector<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_> *)
               &__range1);
  while (bVar2 = __gnu_cxx::operator!=
                           (&__end1_2,
                            (__normal_iterator<dxil_spv::CFGNode_**,_std::vector<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>_>
                             *)&leaf_2), bVar2) {
    ppCVar9 = __gnu_cxx::
              __normal_iterator<dxil_spv::CFGNode_**,_std::vector<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>_>
              ::operator*(&__end1_2);
    (*ppCVar9)->immediate_post_dominator = this->exit_block;
    __gnu_cxx::
    __normal_iterator<dxil_spv::CFGNode_**,_std::vector<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>_>
    ::operator++(&__end1_2);
  }
  std::vector<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>::~vector
            ((vector<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_> *)
             &__range1);
  return;
}

Assistant:

void CFGStructurizer::backwards_visit()
{
	Vector<CFGNode *> leaf_nodes;

	// Traverse from leaf nodes, back through their preds instead.
	// Clear out some state set by forward visit earlier.
	for (auto *node : forward_post_visit_order)
	{
		node->backward_visited = false;
		node->traversing = false;

		// For loops which can only exit from their header block,
		// certain loops will be unreachable when doing a backwards traversal.
		// We'll visit them explicitly later.
		if (node->succ.empty() && !node->succ_back_edge)
			leaf_nodes.push_back(node);
	}

	for (auto *leaf : leaf_nodes)
		backwards_visit(*leaf);

	// It might be case that some continue blocks are not reachable through backwards traversal.
	// This effectively means that our flipped CFG is not reducible, which is rather annoying.
	// To work around this, we fake some branches from the continue block out to other blocks.
	// This way, we ensure that every forward-reachable block is reachable in a backwards traversal as well.
	// The algorithm works where given the innermost loop header A, a block B (A dom B) and continue block C,
	// For successors of B, we will observe some successors which can reach C ({E}), and some successors which can not reach C.
	// C will add fake successor edges to {E}.
	bool need_revisit = false;
	for (size_t i = forward_post_visit_order.size(); i; i--)
	{
		// Resolve outer loops before inner loops since we can have nested loops which need
		// to link into each other.
		auto *node = forward_post_visit_order[i - 1];

		if (node->pred_back_edge)
		{
			if (!node->pred_back_edge->backward_visited)
			{
				LoopBacktracer tracer;
				tracer.trace_to_parent(node, node->pred_back_edge);
				LoopMergeTracer merge_tracer(tracer);
				merge_tracer.trace_from_parent(node);

				// If we have an infinite loop, the continue block will not be reachable with backwards traversal.
				// Also, the only way to exit the loop construct could be through a single return block.
				// In this case, the return block should be moved and considered to be the merge block.
				// We add true branches from the continue block to return block instead of fake branches.

				// Ensure stable codegen order.
				Vector<CFGNode *> exits;
				exits.reserve(merge_tracer.loop_exits.size());
				for (auto *exit_node : merge_tracer.loop_exits)
					exits.push_back(exit_node);
				std::sort(exits.begin(), exits.end(), [](const CFGNode *a, const CFGNode *b) {
					return a->forward_post_visit_order > b->forward_post_visit_order;
				});

				bool transpose_loop_exit = false;
				if (exits.size() == 1)
				{
					auto *exit_node = exits.front();
					// If this is true, we never really leave the loop, which is problematic.
					transpose_loop_exit = exit_node->dominates_all_reachable_exits();

					// Only transpose if we're the innermost header, otherwise, inner loops which try to branch
					// to the return will be considered a multi-break which is very awkward.
					if (transpose_loop_exit)
					{
						auto *innermost_header = get_innermost_loop_header_for(node, exit_node);
						transpose_loop_exit = innermost_header == node;
					}
				}

				if (transpose_loop_exit)
				{
					for (auto *f : exits)
						node->pred_back_edge->add_branch(f);
				}
				else
				{
					// Only consider exits that are themselves backwards reachable.
					// Otherwise, we'll be adding fake succs that resolve to outer infinite loops again.
					for (auto *f : exits)
						if (f->reaches_backward_visited_node())
							node->pred_back_edge->add_fake_branch(f);
				}

				if (!node->pred_back_edge->succ.empty() ||
				    !node->pred_back_edge->fake_succ.empty())
				{
					// Consider this to be backwards visited in case we have a nested inner loop
					// that needs to link up to node->pred_back_edge.
					node->pred_back_edge->backward_visited = true;
				}

				need_revisit = true;
			}
		}
	}

	if (need_revisit)
	{
		for (auto *node : forward_post_visit_order)
		{
			node->backward_visited = false;
			node->traversing = false;
			node->backward_post_visit_order = 0;
		}

		for (auto *leaf : leaf_nodes)
			backwards_visit(*leaf);
	}

	exit_block->backward_post_visit_order = backward_post_visit_order.size();
	exit_block->immediate_post_dominator = exit_block;
	exit_block->backward_visited = true;
	for (auto *leaf : leaf_nodes)
		leaf->immediate_post_dominator = exit_block;
}